

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O3

void __thiscall rapic::scan::initialize_rays(scan *this)

{
  float *pfVar1;
  float *pfVar2;
  header *phVar3;
  pointer phVar4;
  int iVar5;
  long lVar6;
  string *psVar7;
  runtime_error *this_00;
  vector<rapic::header,_std::allocator<rapic::header>_> *__range1;
  header *h;
  header *this_01;
  pointer phVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float __tmp;
  int inc;
  
  lVar6 = get_header_integer(this,"STNID");
  this->station_id_ = (int)lVar6;
  phVar3 = (this->headers_).super__Vector_base<rapic::header,_std::allocator<rapic::header>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->headers_).super__Vector_base<rapic::header,_std::allocator<rapic::header>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_01 != phVar3; this_01 = this_01 + 1)
  {
    iVar5 = std::__cxx11::string::compare((char *)this_01);
    if (iVar5 == 0) {
      lVar6 = header::get_integer(this_01);
      this->volume_id_ = (int)lVar6;
      break;
    }
  }
  get_header_string_abi_cxx11_(this,"PRODUCT");
  std::__cxx11::string::_M_assign((string *)&this->product_);
  phVar4 = (this->headers_).super__Vector_base<rapic::header,_std::allocator<rapic::header>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (phVar8 = (this->headers_).super__Vector_base<rapic::header,_std::allocator<rapic::header>_>.
                _M_impl.super__Vector_impl_data._M_start; phVar8 != phVar4; phVar8 = phVar8 + 1) {
    iVar5 = std::__cxx11::string::compare((char *)phVar8);
    if (iVar5 == 0) {
      iVar5 = __isoc99_sscanf((phVar8->value_)._M_dataplus._M_p,"%d of %d",&this->pass_,
                              &this->pass_count_);
      if (iVar5 != 2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"invalid PASS header");
        goto LAB_00106d9c;
      }
      break;
    }
  }
  psVar7 = get_header_string_abi_cxx11_(this,"IMGFMT");
  iVar5 = std::__cxx11::string::compare((char *)psVar7);
  this->is_rhi_ = iVar5 == 0;
  dVar10 = get_header_real(this,"ANGRES");
  this->angle_resolution_ = (float)dVar10;
  dVar10 = get_header_real(this,"RNGRES");
  dVar11 = get_header_real(this,"STARTRNG");
  dVar12 = get_header_real(this,"ENDRNG");
  pfVar1 = &this->angle_min_;
  pfVar2 = &this->angle_max_;
  iVar5 = __isoc99_sscanf((this->product_)._M_dataplus._M_p,
                          "%*s %*s SECTOR ANGLE1=%f ANGLE2=%f ANGLEINCREASING=%d",pfVar1,pfVar2);
  if (iVar5 == 3) {
    fVar14 = *pfVar1;
    fVar9 = *pfVar2;
    if (fVar14 < fVar9) goto LAB_00106c91;
    do {
      fVar9 = fVar9 + 360.0;
    } while (fVar9 <= fVar14);
  }
  else {
    *pfVar1 = 0.0;
    fVar14 = 0.0;
    fVar9 = 360.0;
  }
  *pfVar2 = fVar9;
LAB_00106c91:
  lVar6 = lroundf((fVar9 - fVar14) / this->angle_resolution_);
  this->rays_ = (int)lVar6;
  dVar13 = remainder((double)(this->angle_max_ - this->angle_min_),(double)this->angle_resolution_);
  if (0.001 < dVar13) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ANGRES is not a factor of sweep length");
  }
  else {
    lVar6 = lround((dVar12 - dVar11) / dVar10);
    this->bins_ = (int)lVar6;
    if ((-1 < (int)lVar6) && (dVar10 = remainder(dVar12 - dVar11,dVar10), dVar10 <= 0.001)) {
      std::vector<rapic::ray_header,_std::allocator<rapic::ray_header>_>::reserve
                (&this->ray_headers_,(long)this->rays_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->level_data_,(long)this->bins_ * (long)this->rays_);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"RNGRES is not a factor of range span");
  }
LAB_00106d9c:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto scan::initialize_rays() -> void
{
  // if this is our first ray, setup the data array

  // store the header fields which we cache
  station_id_ = get_header_integer("STNID");
  if (auto p = find_header("VOLUMEID"))
    volume_id_ = p->get_integer();
  product_ = get_header_string("PRODUCT");
  if (auto p = find_header("PASS"))
  {
    if (sscanf(p->value().c_str(), "%d of %d", &pass_, &pass_count_) != 2)
      throw std::runtime_error{"invalid PASS header"};
  }
  is_rhi_ = get_header_string("IMGFMT") == "RHI";

  // get the mandatory characteristics needed to determine scan structure
  angle_resolution_ = get_header_real("ANGRES");
  double rngres = get_header_real("RNGRES");
  double startrng = get_header_real("STARTRNG");
  double endrng = get_header_real("ENDRNG");

  // if start/end angles are provided, use them to limit our ray count
  int inc = 1;
  if (sscanf(product_.c_str(), "%*s %*s SECTOR ANGLE1=%f ANGLE2=%f ANGLEINCREASING=%d", &angle_min_, &angle_max_, &inc) == 3)
  {
    if (inc == 0)
      std::swap(angle_min_, angle_max_);
    while (angle_max_ <= angle_min_)
      angle_max_ += 360.0;
  }
  else
  {
    angle_min_ = 0.0f;
    angle_max_ = 360.0f;
  }

  rays_ = std::lround((angle_max_ - angle_min_) / angle_resolution_);
  if (remainder(angle_max_ - angle_min_, angle_resolution_) > 0.001)
    throw std::runtime_error{"ANGRES is not a factor of sweep length"};

  bins_ = std::lround((endrng - startrng) / rngres);
  if (bins_ < 0 || remainder(endrng - startrng, rngres) > 0.001)
    throw std::runtime_error("RNGRES is not a factor of range span");

  ray_headers_.reserve(rays_);
  level_data_.resize(rays_ * bins_);
}